

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_open(char *filename,int rwmode,int *handle)

{
  int iVar1;
  size_t sVar2;
  int *in_RDX;
  size_t nread;
  char recbuf [2880];
  int status;
  int ii;
  int copyhandle;
  FILE *diskfile;
  void *in_stack_fffffffffffff478;
  undefined1 local_b78 [1152];
  FILE **in_stack_fffffffffffff908;
  int in_stack_fffffffffffff914;
  char *in_stack_fffffffffffff918;
  int local_34;
  int local_30;
  FILE *local_28;
  int local_4;
  
  if (file_outfile[0] == '\0') {
    *in_RDX = -1;
    for (local_30 = 0; local_30 < 10000; local_30 = local_30 + 1) {
      if (handleTable[local_30].fileptr == (FILE *)0x0) {
        *in_RDX = local_30;
        break;
      }
    }
    if (*in_RDX == -1) {
      local_4 = 0x67;
    }
    else {
      local_34 = file_openfile(in_stack_fffffffffffff918,in_stack_fffffffffffff914,
                               in_stack_fffffffffffff908);
LAB_00138bfd:
      handleTable[*in_RDX].fileptr = (FILE *)local_28;
      handleTable[*in_RDX].currentpos = 0;
      handleTable[*in_RDX].last_io_op = 0;
      local_4 = local_34;
    }
  }
  else {
    local_4 = file_openfile(in_stack_fffffffffffff918,in_stack_fffffffffffff914,
                            in_stack_fffffffffffff908);
    if (local_4 == 0) {
      local_4 = file_create((char *)recbuf._2792_8_,(int *)recbuf._2784_8_);
      if (local_4 == 0) {
        do {
          sVar2 = fread(local_b78,1,0xb40,local_28);
          if (sVar2 == 0) {
            fclose(local_28);
            iVar1 = *in_RDX;
            file_close(0x138b14);
            *in_RDX = iVar1;
            local_34 = file_openfile(in_stack_fffffffffffff918,in_stack_fffffffffffff914,
                                     in_stack_fffffffffffff908);
            file_outfile[0] = '\0';
            goto LAB_00138bfd;
          }
          local_4 = file_write((int)sVar2,in_stack_fffffffffffff478,0x138aba);
        } while (local_4 == 0);
        file_outfile[0] = '\0';
      }
      else {
        ffpmsg((char *)0x138a4e);
        ffpmsg((char *)0x138a5a);
        file_outfile[0] = '\0';
      }
    }
    else {
      file_outfile[0] = '\0';
    }
  }
  return local_4;
}

Assistant:

int file_open(char *filename, int rwmode, int *handle)
{
    FILE *diskfile;
    int copyhandle, ii, status;
    char recbuf[2880];
    size_t nread;

    /*
       if an output filename has been specified as part of the input
       file, as in "inputfile.fits(outputfile.fit)" then we have to
       create the output file, copy the input to it, then reopen the
       the new copy.
    */

    if (*file_outfile)
    {
      /* open the original file, with readonly access */
      status = file_openfile(filename, READONLY, &diskfile);
      if (status) {
        file_outfile[0] = '\0';
        return(status);
      }
      
      /* create the output file */
      status =  file_create(file_outfile,handle);
      if (status)
      {
        ffpmsg("Unable to create output file for copy of input file:");
        ffpmsg(file_outfile);
        file_outfile[0] = '\0';
        return(status);
      }

      /* copy the file from input to output */
      while(0 != (nread = fread(recbuf,1,2880, diskfile)))
      {
        status = file_write(*handle, recbuf, nread);
        if (status) {
	   file_outfile[0] = '\0';
           return(status);
        }
      }

      /* close both files */
      fclose(diskfile);
      copyhandle = *handle;
      file_close(*handle);
      *handle = copyhandle;  /* reuse the old file handle */

      /* reopen the new copy, with correct rwmode */
      status = file_openfile(file_outfile, rwmode, &diskfile);
      file_outfile[0] = '\0';
    }
    else
    {
      *handle = -1;
      for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in table */
      {
        if (handleTable[ii].fileptr == 0)
        {
            *handle = ii;
            break;
        }
      }

      if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

      /*open the file */
      status = file_openfile(filename, rwmode, &diskfile);
    }

    handleTable[*handle].fileptr = diskfile;
    handleTable[*handle].currentpos = 0;
    handleTable[*handle].last_io_op = IO_SEEK;

    return(status);
}